

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

void Ver_ParsePrintLog(Ver_Man_t *pMan)

{
  int *piVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  Abc_Obj_t *pObj;
  void *pvVar7;
  undefined8 uVar8;
  char *pcVar9;
  FILE *__stream;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  char Buffer [1000];
  char local_418 [1000];
  
  pcVar9 = Extra_FileNameGeneric(pMan->pFileName);
  sprintf(local_418,"%s.log",pcVar9);
  if (pcVar9 != (char *)0x0) {
    free(pcVar9);
  }
  __stream = fopen(local_418,"w");
  pVVar10 = pMan->pDesign->vModules;
  iVar2 = pVVar10->nSize;
  lVar11 = (long)iVar2;
  if (0 < lVar11) {
    ppvVar3 = pVVar10->pArray;
    lVar15 = 0;
    do {
      *(undefined4 *)((long)ppvVar3[lVar15] + 0xc0) = 0;
      lVar15 = lVar15 + 1;
    } while (lVar11 != lVar15);
  }
  if (0 < iVar2) {
    ppvVar3 = pVVar10->pArray;
    lVar15 = 0;
    do {
      lVar13 = *(long *)((long)ppvVar3[lVar15] + 0x50);
      lVar16 = (long)*(int *)(lVar13 + 4);
      if (0 < lVar16) {
        lVar13 = *(long *)(lVar13 + 8);
        lVar18 = 0;
        do {
          lVar4 = *(long *)(lVar13 + lVar18 * 8);
          if (((*(uint *)(lVar4 + 0x14) & 0xf) != 8) &&
             (lVar4 = *(long *)(lVar4 + 0x38), lVar4 != 0)) {
            piVar1 = (int *)(lVar4 + 0xc0);
            *piVar1 = *piVar1 + 1;
          }
          lVar18 = lVar18 + 1;
        } while (lVar16 != lVar18);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar11);
  }
  uVar14 = 0;
  fprintf(__stream,"The hierarhical design %s contains %d modules:\n",pMan->pFileName);
  pVVar10 = pMan->pDesign->vModules;
  uVar12 = (ulong)(uint)pVVar10->nSize;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    uVar14 = 0;
    do {
      pvVar5 = pVVar10->pArray[lVar11];
      fprintf(__stream,"%-50s : ",*(undefined8 *)((long)pvVar5 + 8));
      if (*(long *)((long)pvVar5 + 8) == 0) {
LAB_00350607:
        __assert_fail("pNtkBox->pName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
      }
      if (((*(int *)(*(long *)((long)pvVar5 + 0x28) + 4) != 0) ||
          (pcVar9 = "undefbox", *(int *)(*(long *)((long)pvVar5 + 0x30) + 4) != 0)) &&
         (pcVar9 = "blackbox", *(int *)((long)pvVar5 + 4) != 6)) {
        pcVar9 = "logicbox";
      }
      fwrite(pcVar9,8,1,__stream);
      fprintf(__stream," instantiated %6d times ",(ulong)*(uint *)((long)pvVar5 + 0xc0));
      fprintf(__stream," pi = %4d",(ulong)*(uint *)(*(long *)((long)pvVar5 + 0x28) + 4));
      fprintf(__stream," po = %4d",(ulong)*(uint *)(*(long *)((long)pvVar5 + 0x30) + 4));
      fprintf(__stream," nd = %8d",(ulong)*(uint *)((long)pvVar5 + 0x7c));
      fprintf(__stream," lat = %6d",(ulong)*(uint *)((long)pvVar5 + 0x80));
      fprintf(__stream," box = %6d",
              (ulong)(uint)(*(int *)(*(long *)((long)pvVar5 + 0x50) + 4) -
                           *(int *)((long)pvVar5 + 0x80)));
      fputc(10,__stream);
      uVar14 = (ulong)((int)uVar14 + (uint)(*(int *)(*(long *)((long)pvVar5 + 0x30) + 4) == 1));
      lVar11 = lVar11 + 1;
      pVVar10 = pMan->pDesign->vModules;
      uVar12 = (ulong)pVVar10->nSize;
    } while (lVar11 < (long)uVar12);
  }
  if (0 < (int)uVar12) {
    ppvVar3 = pVVar10->pArray;
    uVar17 = 0;
    do {
      *(undefined4 *)((long)ppvVar3[uVar17] + 0xc0) = 0;
      uVar17 = uVar17 + 1;
    } while ((uVar12 & 0xffffffff) != uVar17);
  }
  fprintf(__stream,"The number of modules with one output = %d (%.2f %%).\n",
          ((double)(int)uVar14 * 100.0) / (double)(int)uVar12,uVar14);
  pVVar10 = pMan->pDesign->vModules;
  lVar11 = (long)pVVar10->nSize;
  if (1 < lVar11) {
    lVar15 = 0;
    uVar12 = 0;
    do {
      lVar13 = *(long *)((long)pVVar10->pArray[lVar15] + 0x50);
      lVar16 = (long)*(int *)(lVar13 + 4);
      if (0 < lVar16) {
        lVar18 = 0;
        do {
          lVar4 = *(long *)(*(long *)(lVar13 + 8) + lVar18 * 8);
          if (((*(uint *)(lVar4 + 0x14) & 0xf) != 8) &&
             (lVar6 = *(long *)(lVar4 + 0x38), lVar6 != 0)) {
            if (*(long *)(lVar6 + 8) == 0) goto LAB_00350607;
            iVar2 = *(int *)(*(long *)(lVar6 + 0x28) + 4);
            if ((iVar2 != 0) || (*(int *)(*(long *)(lVar6 + 0x30) + 4) != 0)) {
              lVar21 = (long)*(int *)(*(long *)(lVar4 + 0x40) + 4);
              if (lVar21 < 1) {
                iVar19 = 0;
              }
              else {
                lVar20 = 0;
                iVar19 = 0;
                do {
                  iVar19 = iVar19 + *(int *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar4 + 0x40) +
                                                                          8) + lVar20 * 8) + 8) + 4)
                  ;
                  lVar20 = lVar20 + 1;
                } while (lVar21 != lVar20);
              }
              uVar12 = (ulong)((int)uVar12 +
                              (uint)(iVar19 != iVar2 + *(int *)(*(long *)(lVar6 + 0x30) + 4)));
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar16);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar11);
    if ((int)uVar12 == 0) {
      fwrite("The outputs of all box instances are connected.\n",0x30,1,__stream);
    }
    else {
      fputc(10,__stream);
      fprintf(__stream,"The outputs of %d box instances are not connected:\n",uVar12);
      pVVar10 = pMan->pDesign->vModules;
      if (0 < pVVar10->nSize) {
        lVar11 = 0;
        do {
          pvVar5 = pVVar10->pArray[lVar11];
          lVar15 = *(long *)((long)pvVar5 + 0x50);
          if (0 < *(int *)(lVar15 + 4)) {
            lVar13 = 0;
            do {
              pObj = *(Abc_Obj_t **)(*(long *)(lVar15 + 8) + lVar13 * 8);
              if (((*(uint *)&pObj->field_0x14 & 0xf) != 8) &&
                 (pvVar7 = (pObj->field_5).pData, pvVar7 != (void *)0x0)) {
                if (*(long *)((long)pvVar7 + 8) == 0) goto LAB_00350607;
                iVar2 = *(int *)(*(long *)((long)pvVar7 + 0x28) + 4);
                if ((iVar2 != 0) || (*(int *)(*(long *)((long)pvVar7 + 0x30) + 4) != 0)) {
                  lVar15 = (long)*(int *)((long)&((pObj->field_6).pCopy)->pNtk + 4);
                  if (lVar15 < 1) {
                    uVar12 = 0;
                  }
                  else {
                    lVar16 = 0;
                    uVar12 = 0;
                    do {
                      uVar12 = (ulong)(uint)((int)uVar12 +
                                            *(int *)((&((pObj->field_6).pCopy)->pNext->pNtk)[lVar16]
                                                     ->pName + 4));
                      lVar16 = lVar16 + 1;
                    } while (lVar15 != lVar16);
                  }
                  if ((int)uVar12 != iVar2 + *(int *)(*(long *)((long)pvVar7 + 0x30) + 4)) {
                    uVar8 = *(undefined8 *)((long)pvVar5 + 8);
                    pcVar9 = Abc_ObjName(pObj);
                    fprintf(__stream,
                            "In module \"%s\" instance \"%s\" of box \"%s\" has different numbers of actual/formal nets (%d/%d).\n"
                            ,uVar8,pcVar9,*(undefined8 *)((long)pvVar7 + 8),uVar12,
                            *(int *)(*(long *)((long)pvVar7 + 0x30) + 4) +
                            *(int *)(*(long *)((long)pvVar7 + 0x28) + 4));
                  }
                }
              }
              lVar13 = lVar13 + 1;
              lVar15 = *(long *)((long)pvVar5 + 0x50);
            } while (lVar13 < *(int *)(lVar15 + 4));
          }
          lVar11 = lVar11 + 1;
          pVVar10 = pMan->pDesign->vModules;
        } while (lVar11 < pVVar10->nSize);
      }
    }
  }
  fclose(__stream);
  printf("Hierarchy statistics can be found in log file \"%s\".\n",local_418);
  return;
}

Assistant:

void Ver_ParsePrintLog( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    FILE * pFile;
    char * pNameGeneric;
    char Buffer[1000];
    int i, k, Count1 = 0;

    // open the log file
    pNameGeneric = Extra_FileNameGeneric( pMan->pFileName );
    sprintf( Buffer, "%s.log", pNameGeneric );
    ABC_FREE( pNameGeneric );
    pFile = fopen( Buffer, "w" );

    // count the total number of instances and how many times they occur
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            pNtkBox->fHieVisited++;
        }